

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SrcListAssignCursors(Parse *pParse,SrcList *pList)

{
  int iVar1;
  Parse *in_RSI;
  long in_RDI;
  SrcItem *pItem;
  int i;
  int **local_20;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  
  if (in_RSI != (Parse *)0x0) {
    local_20 = (int **)&in_RSI->zErrMsg;
    for (iVar2 = 0; iVar2 < *(int *)&in_RSI->db; iVar2 = iVar2 + 1) {
      if (*(int *)((long)local_20 + 0x1c) < 0) {
        iVar1 = *(int *)(in_RDI + 0x38);
        *(int *)(in_RDI + 0x38) = iVar1 + 1;
        *(int *)((long)local_20 + 0x1c) = iVar1;
        if ((*(ushort *)((long)local_20 + 0x19) >> 2 & 1) != 0) {
          sqlite3SrcListAssignCursors(in_RSI,(SrcList *)CONCAT44(iVar2,in_stack_ffffffffffffffe8));
        }
      }
      local_20 = local_20 + 9;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListAssignCursors(Parse *pParse, SrcList *pList){
  int i;
  SrcItem *pItem;
  assert( pList || pParse->db->mallocFailed );
  if( ALWAYS(pList) ){
    for(i=0, pItem=pList->a; i<pList->nSrc; i++, pItem++){
      if( pItem->iCursor>=0 ) continue;
      pItem->iCursor = pParse->nTab++;
      if( pItem->fg.isSubquery ){
        assert( pItem->u4.pSubq!=0 );
        assert( pItem->u4.pSubq->pSelect!=0 );
        assert( pItem->u4.pSubq->pSelect->pSrc!=0 );
        sqlite3SrcListAssignCursors(pParse, pItem->u4.pSubq->pSelect->pSrc);
      }
    }
  }
}